

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraylist.c
# Opt level: O2

void array_list_free(array_list *arr)

{
  void *pvVar1;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < arr->length; uVar2 = uVar2 + 1) {
    pvVar1 = arr->array[uVar2];
    if (pvVar1 != (void *)0x0) {
      (*arr->free_fn)(pvVar1);
    }
  }
  free(arr->array);
  free(arr);
  return;
}

Assistant:

extern void array_list_free(struct array_list *arr)
{
	size_t i;
	for (i = 0; i < arr->length; i++)
		if (arr->array[i])
			arr->free_fn(arr->array[i]);
	free(arr->array);
	free(arr);
}